

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptExpr.cpp
# Opt level: O3

void __thiscall GlobOpt::OptimizeChecks(GlobOpt *this,Instr *instr)

{
  OpCode OVar1;
  int iVar2;
  Opnd *this_00;
  Opnd *this_01;
  code *pcVar3;
  OpndKind OVar4;
  bool bVar5;
  int64 iVar6;
  undefined4 *puVar7;
  int64 iVar8;
  IntConstType errorCode;
  
  this_00 = instr->m_src1;
  this_01 = instr->m_src2;
  OVar1 = instr->m_opcode;
  if (OVar1 == TrapIfMinIntOverNegOne) {
    if ((this_00 != (Opnd *)0x0) &&
       ((((OVar4 = IR::Opnd::GetKind(this_00), OVar4 == OpndKindIntConst ||
          (OVar4 = IR::Opnd::GetKind(this_00), OVar4 == OpndKindInt64Const)) ||
         (OVar4 = IR::Opnd::GetKind(this_00), OVar4 == OpndKindAddr)) ||
        (OVar4 = IR::Opnd::GetKind(this_00), OVar4 == OpndKindHelperCall)))) {
      IR::Opnd::GetImmediateValue(this_00,this->func);
      instr->m_opcode = Ld_I4;
    }
    if ((this_01 != (Opnd *)0x0) &&
       (((OVar4 = IR::Opnd::GetKind(this_01), OVar4 == OpndKindIntConst ||
         (OVar4 = IR::Opnd::GetKind(this_01), OVar4 == OpndKindInt64Const)) ||
        ((OVar4 = IR::Opnd::GetKind(this_01), OVar4 == OpndKindAddr ||
         (OVar4 = IR::Opnd::GetKind(this_01), OVar4 == OpndKindHelperCall)))))) {
      iVar6 = IR::Opnd::GetImmediateValue(this_01,this->func);
      bVar5 = (int)iVar6 == -1;
      if (TySize[this_01->m_type] == 8) {
        bVar5 = iVar6 == -1;
      }
      if (!bVar5) {
        instr->m_opcode = Ld_I4;
        goto LAB_00497961;
      }
    }
    if (instr->m_opcode == Ld_I4) {
LAB_00497961:
      IR::Instr::FreeSrc2(instr);
      return;
    }
  }
  else {
    if (OVar1 == TrapIfUnalignedAccess) {
      if (this_00 == (Opnd *)0x0) {
        return;
      }
      OVar4 = IR::Opnd::GetKind(this_00);
      if (((OVar4 != OpndKindIntConst) &&
          (OVar4 = IR::Opnd::GetKind(this_00), OVar4 != OpndKindInt64Const)) &&
         ((OVar4 = IR::Opnd::GetKind(this_00), OVar4 != OpndKindAddr &&
          (OVar4 = IR::Opnd::GetKind(this_00), OVar4 != OpndKindHelperCall)))) {
        return;
      }
      iVar6 = IR::Opnd::GetImmediateValue(this_00,this->func);
      OVar4 = IR::Opnd::GetKind(this_01);
      if ((((OVar4 != OpndKindIntConst) &&
           (OVar4 = IR::Opnd::GetKind(this_01), OVar4 != OpndKindInt64Const)) &&
          (OVar4 = IR::Opnd::GetKind(this_01), OVar4 != OpndKindAddr)) &&
         (OVar4 = IR::Opnd::GetKind(this_01), OVar4 != OpndKindHelperCall)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                           ,0x1bb,"(src2->IsImmediateOpnd())","src2->IsImmediateOpnd()");
        if (!bVar5) goto LAB_004979ac;
        *puVar7 = 0;
      }
      iVar8 = IR::Opnd::GetImmediateValue(this_01,this->func);
      iVar2 = TySize[this_01->m_type];
      if ((-iVar2 & (uint)iVar8) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                           ,0x1be,"((cmpValue & ~mask) == 0)","(cmpValue & ~mask) == 0");
        if (!bVar5) {
LAB_004979ac:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar7 = 0;
      }
      if (((uint)iVar6 & iVar2 - 1U) != (uint)iVar8) {
        errorCode = -0x7ff5e489;
        goto LAB_0049797e;
      }
      IR::Instr::FreeSrc2(instr);
    }
    else {
      if (OVar1 != TrapIfZero) {
        return;
      }
      if (this_00 == (Opnd *)0x0) {
        return;
      }
      OVar4 = IR::Opnd::GetKind(this_00);
      if (((OVar4 != OpndKindIntConst) &&
          (OVar4 = IR::Opnd::GetKind(this_00), OVar4 != OpndKindInt64Const)) &&
         ((OVar4 = IR::Opnd::GetKind(this_00), OVar4 != OpndKindAddr &&
          (OVar4 = IR::Opnd::GetKind(this_00), OVar4 != OpndKindHelperCall)))) {
        return;
      }
      iVar6 = IR::Opnd::GetImmediateValue(this_00,this->func);
      if (iVar6 == 0) {
        errorCode = -0x7ff5e49e;
LAB_0049797e:
        TransformIntoUnreachable(errorCode,instr);
        InsertByteCodeUses(this,instr,false);
        RemoveCodeAfterNoFallthroughInstr(this,instr);
        return;
      }
    }
    instr->m_opcode = Ld_I4;
  }
  return;
}

Assistant:

void
GlobOpt::OptimizeChecks(IR::Instr * const instr)
{
    IR::Opnd* src1 = instr->GetSrc1();
    IR::Opnd* src2 = instr->GetSrc2();

    switch (instr->m_opcode)
    {
    case Js::OpCode::TrapIfZero:
        if (src1 && src1->IsImmediateOpnd())
        {
            int64 val = src1->GetImmediateValue(func);
            if (val != 0)
            {
                instr->m_opcode = Js::OpCode::Ld_I4;
            }
            else
            {
                TransformIntoUnreachable(WASMERR_DivideByZero, instr);
                InsertByteCodeUses(instr);
                RemoveCodeAfterNoFallthroughInstr(instr); //remove dead code
            }
        }
        break;
    case Js::OpCode::TrapIfMinIntOverNegOne:
    {
        int checksLeft = 2;
        if (src1 && src1->IsImmediateOpnd())
        {
            int64 val = src1->GetImmediateValue(func);
            bool isMintInt = src1->GetSize() == 8 ? val == LONGLONG_MIN : (int32)val == INT_MIN;
            if (!isMintInt)
            {
                instr->m_opcode = Js::OpCode::Ld_I4;
            }
            else
            {
                checksLeft--;
            }
        }
        if (src2 && src2->IsImmediateOpnd())
        {
            int64 val = src2->GetImmediateValue(func);
            bool isNegOne = src2->GetSize() == 8 ? val == -1 : (int32)val == -1;
            if (!isNegOne)
            {
                instr->m_opcode = Js::OpCode::Ld_I4;
            }
            else
            {
                checksLeft--;
            }
        }

        if (!checksLeft)
        {
            TransformIntoUnreachable(VBSERR_Overflow, instr);
            instr->FreeSrc2();
            InsertByteCodeUses(instr);
            RemoveCodeAfterNoFallthroughInstr(instr); //remove dead code
        }
        else if (instr->m_opcode == Js::OpCode::Ld_I4)
        {
            instr->FreeSrc2();
        }
        break;
    }
    case Js::OpCode::TrapIfUnalignedAccess:
        if (src1 && src1->IsImmediateOpnd())
        {
            int64 val = src1->GetImmediateValue(func);
            Assert(src2->IsImmediateOpnd());
            uint32 cmpValue = (uint32)src2->GetImmediateValue(func);
            uint32 mask = src2->GetSize() - 1;
            Assert((cmpValue & ~mask) == 0);

            if (((uint32)val & mask) == cmpValue)
            {
                instr->FreeSrc2();
                instr->m_opcode = Js::OpCode::Ld_I4;
            }
            else
            {
                TransformIntoUnreachable(WASMERR_UnalignedAtomicAccess, instr);
                InsertByteCodeUses(instr);
                RemoveCodeAfterNoFallthroughInstr(instr); //remove dead code
            }
        }
        break;
    default:
        return;
    }
}